

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImagePositionCalculator.cpp
# Opt level: O2

array<float,_16UL> * __thiscall
ImagePositionCalculator::GetCenteredRectangleVertexCoordinates
          (ImagePositionCalculator *this,int deviceWidth,int deviceHeight,int imageWidth,
          int imageHeight)

{
  array<float,_16UL> *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = (float)deviceWidth * 0.5 - (float)(imageWidth / 2);
  fVar3 = (float)deviceHeight * 0.5 - (float)(imageHeight / 2);
  *(ulong *)in_RDI->_M_elems = CONCAT44(fVar3,fVar2);
  in_RDI->_M_elems[2] = 0.0;
  in_RDI->_M_elems[3] = 0.0;
  in_RDI->_M_elems[5] = fVar3;
  fVar3 = (float)deviceWidth * 0.5 + (float)(imageWidth / 2);
  fVar1 = (float)deviceHeight * 0.5 + (float)(imageHeight / 2);
  in_RDI->_M_elems[6] = 1.0;
  in_RDI->_M_elems[7] = 0.0;
  *(ulong *)(in_RDI->_M_elems + 8) = CONCAT44(fVar1,fVar3);
  in_RDI->_M_elems[4] = fVar3;
  in_RDI->_M_elems[10] = 1.0;
  in_RDI->_M_elems[0xb] = 1.0;
  in_RDI->_M_elems[0xc] = fVar2;
  in_RDI->_M_elems[0xd] = fVar1;
  in_RDI->_M_elems[0xe] = 0.0;
  in_RDI->_M_elems[0xf] = 1.0;
  return in_RDI;
}

Assistant:

std::array<float, 16> ImagePositionCalculator::GetCenteredRectangleVertexCoordinates(int deviceWidth, int deviceHeight, int imageWidth, int imageHeight)
{
    //assumes we are using an elements array to build the 2 triangles that make up the square
    //format is: x, y, s, t for each point [s, t are the normalized texture coordinates]
    return std::array<float, 16>{
        1.0f * deviceWidth / 2 - imageWidth / 2,
        1.0f * deviceHeight / 2 - imageHeight / 2, 0.0f, 0.0f,
        1.0f * deviceWidth / 2 + imageWidth / 2,
        1.0f * deviceHeight / 2 - imageHeight / 2, 1.0f, 0.0f,
        1.0f * deviceWidth / 2 + imageWidth / 2,
        1.0f * deviceHeight / 2 + imageHeight / 2, 1.0f, 1.0f,
        1.0f * deviceWidth / 2 - imageWidth / 2,
        1.0f * deviceHeight / 2 + imageHeight / 2, 0.0f, 1.0f};
}